

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_RelByte(Expression *expr,uint32_t pcShift)

{
  bool bVar1;
  uint32_t pcShift_local;
  Expression *expr_local;
  
  bVar1 = checkcodesection();
  if ((bVar1) && (bVar1 = reserveSpace(1), bVar1)) {
    bVar1 = rpn_isKnown(expr);
    if (bVar1) {
      writebyte((uint8_t)expr->val);
    }
    else {
      createPatch(PATCHTYPE_BYTE,expr,pcShift);
      writebyte('\0');
    }
    rpn_Free(expr);
  }
  return;
}

Assistant:

void sect_RelByte(struct Expression *expr, uint32_t pcShift)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(1))
		return;

	if (!rpn_isKnown(expr)) {
		createPatch(PATCHTYPE_BYTE, expr, pcShift);
		writebyte(0);
	} else {
		writebyte(expr->val);
	}
	rpn_Free(expr);
}